

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

void __thiscall
math::wide_integer::uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
uintwide_t(uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *this,
          char *str_input)

{
  char *str_input_00;
  bool bVar1;
  unsigned_long count;
  uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> local_48;
  allocator<unsigned_int> local_1d;
  value_type local_1c;
  char *local_18;
  char *str_input_local;
  uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *this_local;
  
  local_1c = 0;
  local_18 = str_input;
  str_input_local = (char *)this;
  std::allocator<unsigned_int>::allocator(&local_1d);
  detail::fixed_dynamic_array<unsigned_int,_512U,_std::allocator<unsigned_int>_>::
  fixed_dynamic_array(&this->values,0x200,&local_1c,&local_1d);
  std::allocator<unsigned_int>::~allocator(&local_1d);
  str_input_00 = local_18;
  count = std::numeric_limits<unsigned_long>::max();
  bVar1 = rd_string(this,str_input_00,count,0);
  if (!bVar1) {
    numeric_limits_uintwide_t_base<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::max()
    ;
    operator=(this,&local_48);
    ~uintwide_t(&local_48);
  }
  return;
}

Assistant:

constexpr uintwide_t(const char* str_input) // NOLINT(google-explicit-constructor,hicpp-explicit-conversions)
      : values
        {
          static_cast<typename representation_type::size_type>(number_of_limbs),
          static_cast<typename representation_type::value_type>(UINT8_C(0)),
          typename representation_type::allocator_type()
        }
    {
      if(!rd_string(str_input, (std::numeric_limits<unsigned_fast_type>::max)(), 0))
      {
        static_cast<void>(operator=((std::numeric_limits<uintwide_t>::max)()));
      }
    }